

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O1

void __thiscall OpenMD::HydroProp::HydroProp(HydroProp *this,Vector3d *cor,Mat6x6d *Xi)

{
  Mat6x6d *pMVar1;
  uint i;
  long lVar2;
  long lVar3;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->cor_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->cor_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->cor_).super_Vector<double,_3U>.data_[2] = 0.0;
  if (&this->cor_ != cor) {
    lVar2 = 0;
    do {
      (this->cor_).super_Vector<double,_3U>.data_[lVar2] =
           (cor->super_Vector<double,_3U>).data_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  pMVar1 = &this->Xi_;
  if (pMVar1 != Xi) {
    lVar2 = 0;
    do {
      lVar3 = 0;
      do {
        (pMVar1->super_RectMatrix<double,_6U,_6U>).data_[0][lVar3] =
             ((RectMatrix<double,_6U,_6U> *)*(double (*) [6])Xi)->data_[0][lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
      lVar2 = lVar2 + 1;
      pMVar1 = (Mat6x6d *)((pMVar1->super_RectMatrix<double,_6U,_6U>).data_ + 1);
      Xi = (Mat6x6d *)((long)Xi + 0x30);
    } while (lVar2 != 6);
  }
  memset(&this->S_,0,0x120);
  this->hasCOR_ = true;
  this->hasXi_ = true;
  this->hasS_ = false;
  return;
}

Assistant:

HydroProp::HydroProp(Vector3d cor, Mat6x6d Xi) :
      cor_(cor), Xi_(Xi), hasCOR_(true), hasXi_(true), hasS_(false) {}